

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::EnumValueName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumValueDescriptor *descriptor)

{
  allocator local_b2;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string name;
  string value_str;
  string class_name;
  
  EnumName_abi_cxx11_(&class_name,*(objectivec **)(this + 0x10),(EnumDescriptor *)descriptor);
  anon_unknown_0::UnderscoresToCamelCase(&value_str,*(string **)(this + 8),true);
  std::operator+(&local_b0,&class_name,"_");
  std::operator+(&name,&local_b0,&value_str);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
  std::__cxx11::string::string((string *)&local_90,"_Value",&local_b2);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_b0,&name,&local_90,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&value_str);
  std::__cxx11::string::~string((string *)&class_name);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumValueName(const EnumValueDescriptor* descriptor) {
  // Because of the Switch enum compatibility, the name on the enum has to have
  // the suffix handing, so it slightly diverges from how nested classes work.
  //   enum Fixed {
  //     FOO = 1
  //   }
  // yields Fixed_Enum and Fixed_Enum_Foo (not Fixed_Foo).
  const std::string class_name = EnumName(descriptor->type());
  const std::string value_str =
      UnderscoresToCamelCase(descriptor->name(), true);
  const std::string name = class_name + "_" + value_str;
  // There aren't really any reserved words with an underscore and a leading
  // capital letter, but playing it safe and checking.
  return SanitizeNameForObjC("", name, "_Value", NULL);
}